

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlChar * xmlXPathParseNCName(xmlXPathParserContextPtr ctxt)

{
  int len;
  xmlChar *pxVar1;
  bool bVar2;
  int count;
  xmlChar *ret;
  xmlChar *in;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->cur == (xmlChar *)0x0)) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else {
    ret = ctxt->cur;
    if ((((0x60 < *ret) && (*ret < 0x7b)) || ((0x40 < *ret && (*ret < 0x5b)))) || (*ret == 0x5f)) {
      do {
        ret = ret + 1;
        if (((*ret < 0x61) || (bVar2 = true, 0x7a < *ret)) &&
           (((*ret < 0x41 || (bVar2 = true, 0x5a < *ret)) &&
            ((((*ret < 0x30 || (bVar2 = true, 0x39 < *ret)) && (bVar2 = true, *ret != '_')) &&
             (bVar2 = true, *ret != '.')))))) {
          bVar2 = *ret == '-';
        }
      } while (bVar2);
      if ((((*ret == ' ') || (*ret == '>')) || ((*ret == '/' || ((*ret == '[' || (*ret == ']'))))))
         || ((*ret == ':' || ((*ret == '@' || (*ret == '*')))))) {
        len = (int)ret - (int)ctxt->cur;
        if (len == 0) {
          return (xmlChar *)0x0;
        }
        pxVar1 = xmlStrndup(ctxt->cur,len);
        if (pxVar1 == (xmlChar *)0x0) {
          xmlXPathPErrMemory(ctxt);
        }
        ctxt->cur = ret;
        return pxVar1;
      }
    }
    ctxt_local = (xmlXPathParserContextPtr)xmlXPathParseNameComplex(ctxt,0);
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

xmlChar *
xmlXPathParseNCName(xmlXPathParserContextPtr ctxt) {
    const xmlChar *in;
    xmlChar *ret;
    int count = 0;

    if ((ctxt == NULL) || (ctxt->cur == NULL)) return(NULL);
    /*
     * Accelerator for simple ASCII names
     */
    in = ctxt->cur;
    if (((*in >= 0x61) && (*in <= 0x7A)) ||
	((*in >= 0x41) && (*in <= 0x5A)) ||
	(*in == '_')) {
	in++;
	while (((*in >= 0x61) && (*in <= 0x7A)) ||
	       ((*in >= 0x41) && (*in <= 0x5A)) ||
	       ((*in >= 0x30) && (*in <= 0x39)) ||
	       (*in == '_') || (*in == '.') ||
	       (*in == '-'))
	    in++;
	if ((*in == ' ') || (*in == '>') || (*in == '/') ||
            (*in == '[') || (*in == ']') || (*in == ':') ||
            (*in == '@') || (*in == '*')) {
	    count = in - ctxt->cur;
	    if (count == 0)
		return(NULL);
	    ret = xmlStrndup(ctxt->cur, count);
            if (ret == NULL)
                xmlXPathPErrMemory(ctxt);
	    ctxt->cur = in;
	    return(ret);
	}
    }
    return(xmlXPathParseNameComplex(ctxt, 0));
}